

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O3

void __thiscall
cfg::tag_int_scalar_t<cfgfile::string_trait_t>::tag_int_scalar_t
          (tag_int_scalar_t<cfgfile::string_trait_t> *this,tag_t<cfgfile::string_trait_t> *owner,
          string_t *name,bool is_mandatory)

{
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  _Rb_tree_header *p_Var1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string_t local_68;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
            ((tag_t<cfgfile::string_trait_t> *)this,owner,name,is_mandatory);
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).m_value = 0;
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).m_constraint = (constraint_t<int> *)0x0;
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_int_scalar_t_0013fb58;
  (this->m_int_scalar_constraint).super_constraint_t<int>._vptr_constraint_t =
       (_func_int **)&PTR__constraint_one_of_t_0013fbb8;
  p_Var1 = &(this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"string_field","");
  paVar2 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_48,local_40 + (long)local_48);
  cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
            (&(this->m_string_field).super_tag_t<cfgfile::string_trait_t>,
             (tag_t<cfgfile::string_trait_t> *)this,&local_68,true);
  (this->m_string_field).super_tag_t<cfgfile::string_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_scalar_t_0013f8c0;
  (this->m_string_field).m_value._M_dataplus._M_p = (pointer)&(this->m_string_field).m_value.field_2
  ;
  (this->m_string_field).m_value._M_string_length = 0;
  (this->m_string_field).m_value.field_2._M_local_buf[0] = '\0';
  (this->m_string_field).m_constraint =
       (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  (this->m_string_field_constraint).
  super_constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_constraint_t = (_func_int **)&PTR__constraint_one_of_t_0013f920;
  p_Var1 = &(this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_dataplus._M_p._0_4_ = 100;
  this_00 = &(this->m_int_scalar_constraint).m_list;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00,
             (int *)&local_68);
  local_68._M_dataplus._M_p._0_4_ = 200;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00,
             (int *)&local_68);
  local_68._M_dataplus._M_p._0_4_ = 300;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00,
             (int *)&local_68);
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).m_constraint =
       &(this->m_int_scalar_constraint).super_constraint_t<int>;
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"one","");
  this_01 = &(this->m_string_field_constraint).m_list;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"two","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"three","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  (this->m_string_field).m_constraint =
       &(this->m_string_field_constraint).
        super_constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  return;
}

Assistant:

tag_int_scalar_t( cfgfile::tag_t< Trait > & owner, const typename Trait::string_t & name, bool is_mandatory )
		:	cfgfile::tag_scalar_t< int, Trait >( owner, name, is_mandatory )
		,	m_string_field( *this, Trait::from_ascii( "string_field" ), true )
		,	m_string_field_constraint()
	{
		m_int_scalar_constraint.add_value( 100 );
		m_int_scalar_constraint.add_value( 200 );
		m_int_scalar_constraint.add_value( 300 );
		this->set_constraint( &m_int_scalar_constraint );

		m_string_field_constraint.add_value( "one" );
		m_string_field_constraint.add_value( "two" );
		m_string_field_constraint.add_value( "three" );
		m_string_field.set_constraint( &m_string_field_constraint );

	}